

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safe_queue.h
# Opt level: O1

bool __thiscall
cppnet::ThreadSafeQueue<cppnet::Log_*>::Pop(ThreadSafeQueue<cppnet::Log_*> *this,Log **value)

{
  _Elt_pointer ppLVar1;
  _Elt_pointer ppLVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_owns = false;
  local_30._M_device = &this->_mutex;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  ppLVar1 = (this->_queue).c.super__Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  ppLVar2 = (this->_queue).c.super__Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppLVar2 != ppLVar1) {
    *value = *ppLVar1;
    std::deque<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>::pop_front(&(this->_queue).c);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return ppLVar2 != ppLVar1;
}

Assistant:

bool Pop(T& value) {
        std::unique_lock<std::mutex> lock(_mutex);
        if (_queue.empty()) {
            return false;
        }
        value = std::move(_queue.front());
        _queue.pop();
        return true;
    }